

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::JUnitReporter::JUnitReporter(JUnitReporter *this,ContextOptions *co)

{
  ContextOptions *co_local;
  JUnitReporter *this_local;
  
  IReporter::IReporter(&this->super_IReporter);
  (this->super_IReporter)._vptr_IReporter = (_func_int **)&PTR_report_query_00149ae0;
  XmlWriter::XmlWriter(&this->xml,co->cout);
  std::mutex::mutex(&this->mutex);
  detail::Timer::Timer(&this->timer);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (&this->deepestSubcaseStackNames);
  JUnitTestCaseData::JUnitTestCaseData(&this->testCaseData);
  this->opt = co;
  this->tc = (TestCaseData *)0x0;
  return;
}

Assistant:

JUnitReporter(const ContextOptions& co)
                : xml(*co.cout)
                , opt(co) {}